

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

void __thiscall ObjectFile::store(ObjectFile *this,bool isCommit)

{
  bool bVar1;
  undefined7 in_register_00000031;
  MutexLocker lock;
  string local_d0;
  File objectFile;
  string local_78;
  File lockFile;
  
  if (((int)CONCAT71(in_register_00000031,isCommit) == 0) && (this->inTransaction != false)) {
    return;
  }
  if (this->valid == false) {
    softHSMLog(7,"store",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x2a0,"Cannot write back an invalid object %s",(this->path)._M_dataplus._M_p);
    return;
  }
  std::__cxx11::string::string((string *)&local_78,(string *)&this->path);
  File::File(&objectFile,&local_78,this->umask,true,true,true,false);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = File::isValid(&objectFile);
  if (bVar1) {
    File::lock(&objectFile,true);
    if (isCommit) {
      bVar1 = writeAttributes(this,&objectFile);
      if (!bVar1) goto LAB_0012ee9e;
    }
    else {
      MutexLocker::MutexLocker(&lock,this->objectMutex);
      std::__cxx11::string::string((string *)&local_d0,(string *)&this->lockpath);
      File::File(&lockFile,&local_d0,this->umask,false,true,true,true);
      std::__cxx11::string::~string((string *)&local_d0);
      bVar1 = writeAttributes(this,&objectFile);
      if (!bVar1) {
        this->valid = false;
        File::~File(&lockFile);
        MutexLocker::~MutexLocker(&lock);
        goto LAB_0012ef3e;
      }
      File::~File(&lockFile);
      MutexLocker::~MutexLocker(&lock);
    }
    this->valid = true;
  }
  else {
    softHSMLog(7,"store",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x2a9,"Cannot open object %s for writing",(this->path)._M_dataplus._M_p);
LAB_0012ee9e:
    this->valid = false;
  }
LAB_0012ef3e:
  File::~File(&objectFile);
  return;
}

Assistant:

void ObjectFile::store(bool isCommit /* = false */)
{
	// Check if we're in the middle of a transaction
	if (!isCommit && inTransaction)
	{
		return;
	}

	if (!valid)
	{
		DEBUG_MSG("Cannot write back an invalid object %s", path.c_str());

		return;
	}

	File objectFile(path, umask, true, true, true, false);

	if (!objectFile.isValid())
	{
		DEBUG_MSG("Cannot open object %s for writing", path.c_str());

		valid = false;

		return;
	}

	objectFile.lock();

	if (!isCommit) {
		MutexLocker lock(objectMutex);
		File lockFile(lockpath, umask, false, true, true);

		if (!writeAttributes(objectFile))
		{
			valid = false;

			return;
		}
	}
	else
	{
		if (!writeAttributes(objectFile))
		{
			valid = false;

			return;
		}
	}

	valid = true;
}